

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O2

void duckdb::ListReverseSortFun::GetFunctions(void)

{
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_601;
  LogicalType local_600 [24];
  _Function_base local_5e8;
  code *local_5d0;
  _Function_base local_5c8;
  code *local_5b0;
  allocator_type local_5a8 [24];
  LogicalType local_590 [24];
  LogicalType local_578 [24];
  LogicalType local_560 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_548;
  LogicalType local_530 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_518;
  LogicalType local_500 [24];
  LogicalType local_4e8 [24];
  ScalarFunction sort_reverse_null_order;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction sort_reverse;
  
  duckdb::LogicalType::LogicalType(local_590,ANY);
  duckdb::LogicalType::LIST((LogicalType *)&sort_reverse_null_order);
  __l._M_len = 1;
  __l._M_array = (iterator)&sort_reverse_null_order;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_518,__l,local_5a8);
  duckdb::LogicalType::LogicalType(local_600,ANY);
  duckdb::LogicalType::LIST(local_530);
  local_5c8._M_functor._8_8_ = 0;
  local_5c8._M_functor._M_unused._M_object = ListSortFunction;
  local_5b0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_5c8._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_4e8,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&sort_reverse,&local_518,local_530,&local_5c8,ListReverseSortBind,0,0,0,local_4e8,0,0,0
            );
  duckdb::LogicalType::~LogicalType(local_4e8);
  std::_Function_base::~_Function_base(&local_5c8);
  duckdb::LogicalType::~LogicalType(local_530);
  duckdb::LogicalType::~LogicalType(local_600);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_518);
  duckdb::LogicalType::~LogicalType((LogicalType *)&sort_reverse_null_order);
  duckdb::LogicalType::~LogicalType(local_590);
  duckdb::LogicalType::LogicalType(local_600,ANY);
  duckdb::LogicalType::LIST(local_590);
  duckdb::LogicalType::LogicalType(local_578,VARCHAR);
  __l_00._M_len = 2;
  __l_00._M_array = local_590;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_548,__l_00,&local_601);
  duckdb::LogicalType::LogicalType((LogicalType *)local_5a8,ANY);
  duckdb::LogicalType::LIST(local_560);
  local_5e8._M_functor._8_8_ = 0;
  local_5e8._M_functor._M_unused._M_object = ListSortFunction;
  local_5d0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_5e8._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_500,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&sort_reverse_null_order,&local_548,local_560,&local_5e8,ListReverseSortBind,0,0,0,
             local_500,0,0,0);
  duckdb::LogicalType::~LogicalType(local_500);
  std::_Function_base::~_Function_base(&local_5e8);
  duckdb::LogicalType::~LogicalType(local_560);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_5a8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_548);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_590 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  duckdb::LogicalType::~LogicalType(local_600);
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  ScalarFunction::ScalarFunction(&local_280,&sort_reverse);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_280);
  ScalarFunction::~ScalarFunction(&local_280);
  ScalarFunction::ScalarFunction(&local_3a8,&sort_reverse_null_order);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_3a8);
  ScalarFunction::~ScalarFunction(&local_3a8);
  ScalarFunction::~ScalarFunction(&sort_reverse_null_order);
  ScalarFunction::~ScalarFunction(&sort_reverse);
  return;
}

Assistant:

ScalarFunctionSet ListReverseSortFun::GetFunctions() {
	// one parameter: list
	ScalarFunction sort_reverse({LogicalType::LIST(LogicalType::ANY)}, LogicalType::LIST(LogicalType::ANY),
	                            ListSortFunction, ListReverseSortBind);

	// two parameters: list, null order
	ScalarFunction sort_reverse_null_order({LogicalType::LIST(LogicalType::ANY), LogicalType::VARCHAR},
	                                       LogicalType::LIST(LogicalType::ANY), ListSortFunction, ListReverseSortBind);

	ScalarFunctionSet list_reverse_sort;
	list_reverse_sort.AddFunction(sort_reverse);
	list_reverse_sort.AddFunction(sort_reverse_null_order);
	return list_reverse_sort;
}